

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  istream local_220 [8];
  ifstream infile;
  char **argv_local;
  int argc_local;
  
  init_scheme();
  if (argc < 2) {
    argv_local._4_4_ = run_REPL();
  }
  else {
    std::ifstream::ifstream(local_220,argv[1],_S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,"Error: no such file\n");
      argv_local._4_4_ = 1;
    }
    else {
      argv_local._4_4_ = run_file(local_220);
    }
    std::ifstream::~ifstream(local_220);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    init_scheme();
    if(argc <= 1)
    {
        return run_REPL();
    }
    else
    {
        std::ifstream infile(argv[1]);
        if(!infile.is_open())
        {
            std::cerr << "Error: no such file\n";
            return 1;
        }
        return run_file(infile);
    }
}